

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrmatrix.h
# Opt level: O1

int __thiscall
TPZDohrMatrix<double,_TPZDohrSubstruct<double>_>::ClassId
          (TPZDohrMatrix<double,_TPZDohrSubstruct<double>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string local_bb8;
  TPZDohrSubstruct<double> local_b98;
  
  local_bb8._M_dataplus._M_p = (pointer)&local_bb8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bb8,"TPZDohrMatrix","");
  uVar1 = Hash(&local_bb8);
  iVar2 = TPZMatrix<double>::ClassId(&this->super_TPZMatrix<double>);
  TPZDohrSubstruct<double>::TPZDohrSubstruct(&local_b98);
  iVar3 = TPZDohrSubstruct<double>::ClassId(&local_b98);
  TPZDohrSubstruct<double>::~TPZDohrSubstruct(&local_b98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bb8._M_dataplus._M_p != &local_bb8.field_2) {
    operator_delete(local_bb8._M_dataplus._M_p,local_bb8.field_2._M_allocated_capacity + 1);
  }
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZDohrMatrix<TVar, TSubStruct>::ClassId() const{
    return Hash("TPZDohrMatrix") ^ TPZMatrix<TVar>::ClassId() << 1 ^ TSubStruct().ClassId() << 2;
}